

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_7::Validator::BeginBlockExpr(Validator *this,BlockExpr *expr)

{
  Opcode local_24;
  BlockExpr *local_20;
  BlockExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)7>).super_Expr.loc;
  local_20 = expr;
  expr_local = (BlockExpr *)this;
  Opcode::Opcode(&local_24,Block);
  CheckBlockDeclaration
            (this,&(expr->super_ExprMixin<(wabt::ExprType)7>).super_Expr.loc,local_24,
             &(local_20->block).decl);
  TypeChecker::OnBlock
            (&this->typechecker_,&(local_20->block).decl.sig.param_types,
             &(local_20->block).decl.sig.result_types);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::BeginBlockExpr(BlockExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckBlockDeclaration(&expr->loc, Opcode::Block, &expr->block.decl);
  typechecker_.OnBlock(expr->block.decl.sig.param_types,
                       expr->block.decl.sig.result_types);
  return Result::Ok;
}